

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.h
# Opt level: O0

void __thiscall adios2::core::Attribute<unsigned_long>::~Attribute(Attribute<unsigned_long> *this)

{
  undefined8 *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  
  *in_RDI = &PTR__Attribute_0112b140;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(unaff_retaddr);
  AttributeBase::~AttributeBase((AttributeBase *)0x82db44);
  return;
}

Assistant:

~Attribute() = default;